

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::loader_life_support::~loader_life_support(loader_life_support *this)

{
  bool bVar1;
  loader_life_support *plVar2;
  reference pp_Var3;
  _object *item;
  iterator __end2;
  iterator __begin2;
  unordered_set<_object_*,_std::hash<_object_*>,_std::equal_to<_object_*>,_std::allocator<_object_*>_>
  *__range2;
  loader_life_support *this_local;
  
  plVar2 = get_stack_top();
  if (plVar2 != this) {
    pybind11_fail("loader_life_support: internal error");
  }
  set_stack_top(this->parent);
  __end2 = std::
           unordered_set<_object_*,_std::hash<_object_*>,_std::equal_to<_object_*>,_std::allocator<_object_*>_>
           ::begin(&this->keep_alive);
  item = (_object *)
         std::
         unordered_set<_object_*,_std::hash<_object_*>,_std::equal_to<_object_*>,_std::allocator<_object_*>_>
         ::end(&this->keep_alive);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<_object_*,_false>,
                       (_Node_iterator_base<_object_*,_false> *)&item);
    if (!bVar1) break;
    pp_Var3 = std::__detail::_Node_iterator<_object_*,_true,_false>::operator*(&__end2);
    _Py_DECREF(*pp_Var3);
    std::__detail::_Node_iterator<_object_*,_true,_false>::operator++(&__end2);
  }
  std::
  unordered_set<_object_*,_std::hash<_object_*>,_std::equal_to<_object_*>,_std::allocator<_object_*>_>
  ::~unordered_set(&this->keep_alive);
  return;
}

Assistant:

~loader_life_support() {
        if (get_stack_top() != this) {
            pybind11_fail("loader_life_support: internal error");
        }
        set_stack_top(parent);
        for (auto *item : keep_alive) {
            Py_DECREF(item);
        }
    }